

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::forcingColumn<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,HighsMatrixSlice<HighsTripletListSlice> *colVec,
          double cost,double boundVal,bool atInfiniteUpper,bool colIntegral)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  byte in_CL;
  int __c;
  undefined8 in_RDX;
  int in_ESI;
  iterator *rhs;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_RDI;
  byte in_R8B;
  HighsDataStack *in_XMM0_Qa;
  HighsSliceNonzero *colVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletListSlice> *__range2;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *this_01;
  ForcingColumn *in_stack_ffffffffffffff48;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff50;
  iterator local_78;
  iterator local_58;
  undefined8 local_38;
  byte local_2a;
  byte local_29;
  HighsDataStack *local_20;
  undefined8 local_18;
  int local_c;
  
  local_29 = in_CL & 1;
  local_2a = in_R8B & 1;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x72d78f);
  local_38 = local_18;
  HighsMatrixSlice<HighsTripletListSlice>::begin(in_stack_ffffffffffffff40);
  HighsMatrixSlice<HighsTripletListSlice>::end(in_stack_ffffffffffffff40);
  while( true ) {
    rhs = &local_78;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_58,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_58);
    in_stack_ffffffffffffff48 = (ForcingColumn *)(in_RDI + 8);
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 5);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff50 =
         (HighsPostsolveStack *)
         std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48,(double *)this_01);
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_58);
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_c);
  HighsDataStack::push<presolve::HighsPostsolveStack::ForcingColumn,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(local_20,in_RDI);
  reductionAdded(in_stack_ffffffffffffff50,type);
  return;
}

Assistant:

void forcingColumn(HighsInt col,
                     const HighsMatrixSlice<ColStorageFormat>& colVec,
                     double cost, double boundVal, bool atInfiniteUpper,
                     bool colIntegral) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(ForcingColumn{cost, boundVal, origColIndex[col],
                                       atInfiniteUpper, colIntegral});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kForcingColumn);
  }